

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubjson_cursor_tests.cpp
# Opt level: O3

bool __thiscall
remove_mark_ubjson_filter::operator()
          (remove_mark_ubjson_filter *this,staj_event *event,ser_context *param_2)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  
  if (event->event_type_ == key) {
    bVar2 = ::jsoncons::basic_staj_event<char>::
            get<std::basic_string_view<char,std::char_traits<char>>>(event);
    if ((bVar2._M_len == 4) && (*(int *)bVar2._M_str == 0x6b72616d)) {
      bVar1 = true;
      goto LAB_007b507a;
    }
  }
  if (this->reject_next_ != true) {
    return true;
  }
  bVar1 = false;
LAB_007b507a:
  this->reject_next_ = bVar1;
  return false;
}

Assistant:

bool operator()(const staj_event& event, const ser_context&) 
    {
        if (event.event_type()  == staj_event_type::key &&
            event.get<jsoncons::string_view>() == "mark")
        {
            reject_next_ = true;
            return false;
        }
        else if (reject_next_)
        {
            reject_next_ = false;
            return false;
        }
        else
        {
            return true;
        }
    }